

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bassignmidstr(bstring a,const_bstring b,int left,int len)

{
  int iVar1;
  int local_28;
  int local_24;
  int len_local;
  int left_local;
  const_bstring b_local;
  bstring a_local;
  
  if (((b == (const_bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen < 0)) {
    a_local._4_4_ = -1;
  }
  else {
    local_28 = len;
    local_24 = left;
    if (left < 0) {
      local_28 = left + len;
      local_24 = 0;
    }
    if (b->slen - local_24 < local_28) {
      local_28 = b->slen - local_24;
    }
    if (((a == (bstring)0x0) || (a->data == (uchar *)0x0)) ||
       ((a->mlen < a->slen || ((a->slen < 0 || (a->mlen == 0)))))) {
      a_local._4_4_ = -1;
    }
    else {
      if (local_28 < 1) {
        a->slen = 0;
      }
      else {
        iVar1 = balloc(a,local_28);
        if (iVar1 != 0) {
          return -1;
        }
        memmove(a->data,b->data + local_24,(long)local_28);
        a->slen = local_28;
      }
      a->data[a->slen] = '\0';
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

int bassignmidstr (bstring a, const_bstring b, int left, int len) {
	if (b == NULL || b->data == NULL || b->slen < 0)
		return BSTR_ERR;

	if (left < 0) {
		len += left;
		left = 0;
	}

	if (len > b->slen - left) len = b->slen - left;

	if (a == NULL || a->data == NULL || a->mlen < a->slen ||
	    a->slen < 0 || a->mlen == 0)
		return BSTR_ERR;

	if (len > 0) {
		if (balloc (a, len) != BSTR_OK) return BSTR_ERR;
		bstr__memmove (a->data, b->data + left, len);
		a->slen = len;
	} else {
		a->slen = 0;
	}
	a->data[a->slen] = (unsigned char) '\0';
	return BSTR_OK;
}